

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O1

void __thiscall MC::MC_Driver::~MC_Driver(MC_Driver *this)

{
  ~MC_Driver(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

MC::MC_Driver::~MC_Driver()
{
   delete(scanner);
   scanner = nullptr;
   delete(parser);
   parser = nullptr;
}